

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_monitor.c
# Opt level: O2

void outputHandleScale(void *userData,wl_output *output,int32_t factor)

{
  _GLFWscaleWayland *p_Var1;
  long lVar2;
  long lVar3;
  long lVar4;
  _GLFWwindow *window;
  
  *(int32_t *)((long)userData + 0x118) = factor;
  window = (_GLFWwindow *)&_glfw.windowListHead;
LAB_00122bc1:
  do {
    window = window->next;
    if (window == (_GLFWwindow *)0x0) {
      return;
    }
    lVar3 = (window->wl).outputScaleCount + 1;
    lVar2 = 0;
    do {
      lVar4 = lVar2;
      lVar3 = lVar3 + -1;
      if (lVar3 == 0) goto LAB_00122bc1;
      p_Var1 = (window->wl).outputScales;
      lVar2 = lVar4 + 0x10;
    } while (*(long *)((long)&p_Var1->output + lVar4) != *(long *)((long)userData + 0x100));
    *(undefined4 *)((long)&p_Var1->factor + lVar4) = *(undefined4 *)((long)userData + 0x118);
    _glfwUpdateBufferScaleFromOutputsWayland(window);
  } while( true );
}

Assistant:

static void outputHandleScale(void* userData,
                              struct wl_output* output,
                              int32_t factor)
{
    struct _GLFWmonitor* monitor = userData;

    monitor->wl.scale = factor;

    for (_GLFWwindow* window = _glfw.windowListHead; window; window = window->next)
    {
        for (size_t i = 0; i < window->wl.outputScaleCount; i++)
        {
            if (window->wl.outputScales[i].output == monitor->wl.output)
            {
                window->wl.outputScales[i].factor = monitor->wl.scale;
                _glfwUpdateBufferScaleFromOutputsWayland(window);
                break;
            }
        }
    }
}